

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.cpp
# Opt level: O0

maybe<pstore::uint128,_void> *
pstore::uint128::from_hex_string(maybe<pstore::uint128,_void> *__return_storage_ptr__,string *str)

{
  long lVar1;
  maybe<unsigned_long,_void> local_30;
  anon_class_8_1_ba1d7991 local_20;
  string *local_18;
  string *str_local;
  
  local_18 = str;
  str_local = (string *)__return_storage_ptr__;
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0x20) {
    local_20.str = local_18;
    anon_unknown.dwarf_1cee72::get64(&local_30,local_18,0);
    operator>>=(__return_storage_ptr__,&local_30,local_20);
    maybe<unsigned_long,_void>::~maybe(&local_30);
  }
  else {
    nothing<pstore::uint128>();
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<uint128> uint128::from_hex_string (std::string const & str) {
        if (str.length () != 32) {
            return nothing<uint128> ();
        }
        return get64 (str, 0U) >>= [&] (std::uint64_t const high) {
            return get64 (str, 16U) >>= [&] (std::uint64_t const low) {
                return just (uint128{high, low});
            };
        };
    }